

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O2

size_t BrotliZopfliComputeShortestPath
                 (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
                 size_t ringbuffer_mask,BrotliEncoderParams *params,size_t max_backward_limit,
                 int *dist_cache,HasherHandle hasher,ZopfliNode *nodes)

{
  ulong uVar1;
  int iVar2;
  undefined4 uVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  size_t sVar13;
  uint uVar14;
  long lVar15;
  int *data;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  uint8_t *puVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  bool bVar26;
  ZopfliNode *nodes_00;
  ulong local_19b0;
  BackwardMatch *local_19a8;
  ulong local_19a0;
  uint local_1988;
  uint local_1980;
  size_t local_1970;
  ulong local_1968;
  long local_1950;
  long local_1940;
  ulong local_1910;
  uint32_t local_18f8 [38];
  StartPosQueue queue;
  BackwardMatch matches [384];
  ZopfliCostModel model;
  
  uVar14 = 0x145;
  if (params->quality < 0xb) {
    uVar14 = 0x96;
  }
  lVar15 = num_bytes - 0x7f;
  if (num_bytes < 0x7f) {
    lVar15 = 0;
  }
  nodes->length = 0;
  (nodes->u).cost = 0.0;
  InitZopfliCostModel(m,&model,&params->dist,num_bytes);
  ZopfliCostModelSetFromLiteralCosts(&model,position,ringbuffer,ringbuffer_mask);
  queue.idx_ = 0;
  local_1970 = 0;
  do {
    if (num_bytes <= local_1970 + 3) {
      CleanupZopfliCostModel(m,&model);
      sVar13 = ComputeShortestPathFromNodes(num_bytes,nodes);
      return sVar13;
    }
    uVar1 = local_1970 + position;
    sVar13 = max_backward_limit;
    if (uVar1 < max_backward_limit) {
      sVar13 = uVar1;
    }
    uVar10 = num_bytes - local_1970;
    uVar18 = 0x10;
    if (params->quality == 0xb) {
      uVar18 = 0x40;
    }
    uVar9 = 0;
    if (uVar18 <= uVar1) {
      uVar9 = uVar1 - uVar18;
    }
    data = (int *)(ringbuffer + (uVar1 & ringbuffer_mask));
    local_19a8 = matches;
    uVar18 = uVar1;
    uVar20 = 1;
    while (((uVar18 = uVar18 - 1, uVar9 < uVar18 && (uVar20 < 3)) && (uVar1 - uVar18 <= sVar13))) {
      uVar21 = uVar18 & ringbuffer_mask;
      if (((uint8_t)*data == ringbuffer[uVar21]) &&
         (*(uint8_t *)((long)data + 1) == ringbuffer[uVar21 + 1])) {
        uVar23 = 0;
        lVar11 = 0;
LAB_00116476:
        uVar6 = (ulong)((uint)uVar10 & 7);
        uVar12 = uVar10 & 0xfffffffffffffff8;
        if (uVar10 >> 3 == uVar23) {
          for (; (uVar23 = uVar10, uVar6 != 0 &&
                 (uVar23 = uVar12, ringbuffer[uVar12 + uVar21] == *(uint8_t *)((long)data + uVar12))
                 ); uVar12 = uVar12 + 1) {
            uVar6 = uVar6 - 1;
          }
        }
        else {
          if (*(ulong *)(data + uVar23 * 2) == *(ulong *)(ringbuffer + uVar23 * 8 + uVar21))
          goto code_r0x00116488;
          uVar23 = *(ulong *)(ringbuffer + uVar23 * 8 + uVar21) ^ *(ulong *)(data + uVar23 * 2);
          uVar21 = 0;
          if (uVar23 != 0) {
            for (; (uVar23 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
            }
          }
          uVar23 = (uVar21 >> 3 & 0x1fffffff) - lVar11;
        }
        if (uVar20 < uVar23) {
          local_19a8->distance = (uint32_t)(uVar1 - uVar18);
          local_19a8->length_and_code = (int)uVar23 << 5;
          local_19a8 = local_19a8 + 1;
          uVar20 = uVar23;
        }
      }
    }
    local_1988 = (uint)ringbuffer_mask;
    if (uVar20 < uVar10) {
      uVar9 = (ulong)((uint)(*data * 0x1e35a7bd) >> 0xf);
      uVar8 = *(uint *)(hasher + uVar9 * 4 + 0x30);
      uVar18 = uVar10;
      if (0x7f < uVar10) {
        *(int *)(hasher + uVar9 * 4 + 0x30) = (int)uVar1;
        uVar18 = 0x80;
      }
      uVar9 = *(ulong *)(hasher + 0x28);
      uVar21 = uVar9 & uVar1;
      local_1940 = uVar21 * 2 + 1;
      local_1950 = uVar21 * 2;
      uVar21 = 0;
      local_1968 = 0;
      lVar11 = 0x40;
      while (uVar23 = uVar1 - uVar8, uVar23 != 0) {
        bVar26 = lVar11 == 0;
        lVar11 = lVar11 + -1;
        if ((sVar13 < uVar23) || (bVar26)) break;
        uVar6 = local_1968;
        if (uVar21 < local_1968) {
          uVar6 = uVar21;
        }
        lVar4 = uVar6 + (uVar8 & local_1988);
        uVar12 = uVar10 - uVar6;
        uVar16 = uVar12 & 0xfffffffffffffff8;
        uVar24 = 0;
        lVar17 = 0;
LAB_001165eb:
        if (uVar12 >> 3 == uVar24) {
          local_1910 = (ulong)((uint)uVar12 & 7);
          puVar19 = ringbuffer + (lVar4 - lVar17);
          for (; (bVar26 = local_1910 != 0, local_1910 = local_1910 - 1, uVar24 = uVar12, bVar26 &&
                 (uVar24 = uVar16, *(uint8_t *)((long)data + uVar16 + uVar6) == *puVar19));
              uVar16 = uVar16 + 1) {
            puVar19 = puVar19 + 1;
          }
        }
        else {
          uVar25 = *(ulong *)((long)data + uVar24 * 8 + uVar6);
          if (*(ulong *)(ringbuffer + uVar24 * 8 + lVar4) == uVar25) goto code_r0x00116608;
          uVar25 = uVar25 ^ *(ulong *)(ringbuffer + uVar24 * 8 + lVar4);
          uVar12 = 0;
          if (uVar25 != 0) {
            for (; (uVar25 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
            }
          }
          uVar24 = (uVar12 >> 3 & 0x1fffffff) - lVar17;
        }
        uVar24 = uVar24 + uVar6;
        if (local_19a8 == (BackwardMatch *)0x0) {
          local_19a8 = (BackwardMatch *)0x0;
        }
        else if (uVar20 < uVar24) {
          local_19a8->distance = (uint32_t)uVar23;
          local_19a8->length_and_code = (int)uVar24 << 5;
          local_19a8 = local_19a8 + 1;
          uVar20 = uVar24;
        }
        uVar7 = (uint)uVar9;
        if (uVar18 <= uVar24) {
          if (uVar10 < 0x80) goto LAB_001167c1;
          *(undefined4 *)(hasher + local_1950 * 4 + 0x80038) =
               *(undefined4 *)(hasher + (ulong)(uVar7 & uVar8) * 8 + 0x80038);
          uVar3 = *(undefined4 *)(hasher + (ulong)(uVar7 & uVar8) * 8 + 0x8003c);
          goto LAB_001167ae;
        }
        if (ringbuffer[uVar24 + (uVar8 & local_1988)] < *(byte *)((long)data + uVar24)) {
          if (0x7f < uVar10) {
            *(uint *)(hasher + local_1950 * 4 + 0x80038) = uVar8;
          }
          lVar4 = (ulong)(uVar8 & uVar7) * 2 + 1;
          uVar21 = uVar24;
          local_1950 = lVar4;
        }
        else {
          if (0x7f < uVar10) {
            *(uint *)(hasher + local_1940 * 4 + 0x80038) = uVar8;
          }
          lVar4 = (ulong)(uVar8 & uVar7) * 2;
          local_1968 = uVar24;
          local_1940 = lVar4;
        }
        uVar8 = *(uint *)(hasher + lVar4 * 4 + 0x80038);
      }
      if (0x7f < uVar10) {
        uVar3 = *(undefined4 *)(hasher + 0x80030);
        *(undefined4 *)(hasher + local_1950 * 4 + 0x80038) = uVar3;
LAB_001167ae:
        *(undefined4 *)(hasher + local_1940 * 4 + 0x80038) = uVar3;
      }
    }
LAB_001167c1:
    for (lVar11 = 0; lVar11 != 0x26; lVar11 = lVar11 + 1) {
      local_18f8[lVar11] = 0xfffffff;
    }
    uVar18 = uVar20 + 1;
    if (uVar20 + 1 < 5) {
      uVar18 = 4;
    }
    nodes_00 = (ZopfliNode *)0x11680a;
    iVar2 = BrotliFindAllStaticDictionaryMatches
                      (&params->dictionary,(uint8_t *)data,uVar18,uVar10,local_18f8);
    if (iVar2 != 0) {
      nodes_00 = (ZopfliNode *)0x25;
      if (0x24 < uVar10) {
        uVar10 = 0x25;
      }
      iVar2 = (int)uVar18 << 5;
      for (; uVar18 <= uVar10; uVar18 = uVar18 + 1) {
        uVar8 = local_18f8[uVar18];
        if ((uVar8 < 0xfffffff) &&
           (uVar9 = (ulong)(uVar8 >> 5) + sVar13 + 1, uVar9 <= (params->dist).max_distance)) {
          uVar8 = uVar8 & 0x1f;
          local_19a8->distance = (uint32_t)uVar9;
          if (uVar18 == uVar8) {
            uVar8 = 0;
          }
          local_19a8->length_and_code = uVar8 + iVar2;
          local_19a8 = local_19a8 + 1;
        }
        iVar2 = iVar2 + 0x20;
      }
    }
    if ((long)local_19a8 - (long)matches == 0) {
      sVar13 = 0;
    }
    else {
      sVar13 = (long)local_19a8 - (long)matches >> 3;
      if (uVar14 < local_19a8[-1].length_and_code >> 5) {
        matches[0] = matches[sVar13 - 1];
        nodes_00 = (ZopfliNode *)0x1;
        sVar13 = 1;
      }
    }
    sVar5 = UpdateNodes(num_bytes,position,local_1970,ringbuffer,ringbuffer_mask,params,
                        max_backward_limit,dist_cache,sVar13,matches,&model,&queue,nodes);
    uVar18 = 0;
    if (0x3fff < sVar5) {
      uVar18 = sVar5;
    }
    if (sVar13 == 1) {
      uVar8 = matches[0].length_and_code >> 5;
      if ((uVar14 < uVar8) && (uVar18 < uVar8)) {
        uVar18 = (ulong)uVar8;
      }
    }
    if (1 < uVar18) {
      uVar10 = uVar1 + 1;
      uVar9 = uVar18 + uVar1;
      if (lVar15 + position <= uVar18 + uVar1) {
        uVar9 = lVar15 + position;
      }
      uVar20 = uVar9 - 0x3f;
      if (uVar9 < uVar1 + 0x40) {
        uVar20 = uVar10;
      }
      if (uVar1 + 0x201 <= uVar20) {
        for (; uVar10 < uVar20; uVar10 = uVar10 + 8) {
          uVar1 = *(ulong *)(hasher + 0x28);
          uVar6 = uVar10 & ringbuffer_mask;
          uVar21 = (ulong)((uint)(*(int *)(ringbuffer + uVar6) * 0x1e35a7bd) >> 0xf);
          uVar8 = *(uint *)(hasher + uVar21 * 4 + 0x30);
          local_19a0 = (uVar1 & uVar10) * 2 + 1;
          local_19b0 = (uVar1 & uVar10) * 2;
          *(int *)(hasher + uVar21 * 4 + 0x30) = (int)uVar10;
          uVar23 = 0;
          uVar21 = 0;
          nodes_00 = (ZopfliNode *)0x40;
          lVar11 = 0x40;
          while (uVar10 != uVar8) {
            bVar26 = lVar11 == 0;
            lVar11 = lVar11 + -1;
            if ((uVar1 - 0xf < uVar10 - uVar8) || (bVar26)) break;
            uVar12 = uVar21;
            if (uVar23 < uVar21) {
              uVar12 = uVar23;
            }
            lVar4 = uVar12 + (uVar8 & local_1988);
            uVar25 = 0x80 - uVar12;
            uVar16 = uVar25 & 0xfffffffffffffff8;
            uVar24 = 0;
            lVar17 = 0;
LAB_00116a81:
            if (uVar25 >> 3 == uVar24) {
              uVar22 = (ulong)((uint)uVar25 & 7);
              puVar19 = ringbuffer + (lVar4 - lVar17);
              for (; (bVar26 = uVar22 != 0, uVar22 = uVar22 - 1, uVar24 = uVar25, bVar26 &&
                     (uVar24 = uVar16, ringbuffer[uVar16 + uVar12 + uVar6] == *puVar19));
                  uVar16 = uVar16 + 1) {
                puVar19 = puVar19 + 1;
              }
            }
            else {
              if (*(ulong *)(ringbuffer + uVar24 * 8 + lVar4) ==
                  *(ulong *)(ringbuffer + uVar24 * 8 + uVar12 + uVar6)) goto code_r0x00116a9d;
              uVar24 = *(ulong *)(ringbuffer + uVar24 * 8 + uVar12 + uVar6) ^
                       *(ulong *)(ringbuffer + uVar24 * 8 + lVar4);
              uVar16 = 0;
              if (uVar24 != 0) {
                for (; (uVar24 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                }
              }
              uVar24 = (uVar16 >> 3 & 0x1fffffff) - lVar17;
            }
            uVar24 = uVar24 + uVar12;
            local_1980 = (uint)uVar1;
            if (0x7f < uVar24) {
              *(undefined4 *)(hasher + local_19b0 * 4 + 0x80038) =
                   *(undefined4 *)(hasher + (ulong)(local_1980 & uVar8) * 8 + 0x80038);
              uVar3 = *(undefined4 *)(hasher + (ulong)(local_1980 & uVar8) * 8 + 0x8003c);
              goto LAB_00116ba9;
            }
            uVar12 = (ulong)(uVar8 & local_1980) * 2;
            if (ringbuffer[uVar24 + (uVar8 & local_1988)] < ringbuffer[uVar24 + uVar6]) {
              *(uint *)(hasher + local_19b0 * 4 + 0x80038) = uVar8;
              uVar12 = uVar12 | 1;
              uVar23 = uVar24;
              local_19b0 = uVar12;
            }
            else {
              *(uint *)(hasher + local_19a0 * 4 + 0x80038) = uVar8;
              uVar21 = uVar24;
              local_19a0 = uVar12;
            }
            uVar8 = *(uint *)(hasher + uVar12 * 4 + 0x80038);
          }
          uVar3 = *(undefined4 *)(hasher + 0x80030);
          *(undefined4 *)(hasher + local_19b0 * 4 + 0x80038) = uVar3;
LAB_00116ba9:
          *(undefined4 *)(hasher + local_19a0 * 4 + 0x80038) = uVar3;
        }
      }
      for (; uVar20 < uVar9; uVar20 = uVar20 + 1) {
        uVar1 = *(ulong *)(hasher + 0x28);
        uVar23 = uVar20 & ringbuffer_mask;
        uVar10 = (ulong)((uint)(*(int *)(ringbuffer + uVar23) * 0x1e35a7bd) >> 0xf);
        uVar8 = *(uint *)(hasher + uVar10 * 4 + 0x30);
        local_19a0 = (uVar1 & uVar20) * 2 + 1;
        local_19b0 = (uVar1 & uVar20) * 2;
        *(int *)(hasher + uVar10 * 4 + 0x30) = (int)uVar20;
        uVar21 = 0;
        uVar10 = 0;
        nodes_00 = (ZopfliNode *)0x40;
        lVar11 = 0x40;
        while (uVar20 != uVar8) {
          bVar26 = lVar11 == 0;
          lVar11 = lVar11 + -1;
          if ((uVar1 - 0xf < uVar20 - uVar8) || (bVar26)) break;
          uVar6 = uVar10;
          if (uVar21 < uVar10) {
            uVar6 = uVar21;
          }
          lVar4 = uVar6 + (uVar8 & local_1988);
          uVar24 = 0x80 - uVar6;
          uVar12 = uVar24 & 0xfffffffffffffff8;
          uVar16 = 0;
          lVar17 = 0;
LAB_00116c8e:
          if (uVar24 >> 3 == uVar16) {
            uVar25 = (ulong)((uint)uVar24 & 7);
            puVar19 = ringbuffer + (lVar4 - lVar17);
            for (; (bVar26 = uVar25 != 0, uVar25 = uVar25 - 1, uVar16 = uVar24, bVar26 &&
                   (uVar16 = uVar12, ringbuffer[uVar12 + uVar6 + uVar23] == *puVar19));
                uVar12 = uVar12 + 1) {
              puVar19 = puVar19 + 1;
            }
          }
          else {
            if (*(ulong *)(ringbuffer + uVar16 * 8 + lVar4) ==
                *(ulong *)(ringbuffer + uVar16 * 8 + uVar6 + uVar23)) goto code_r0x00116caa;
            uVar16 = *(ulong *)(ringbuffer + uVar16 * 8 + uVar6 + uVar23) ^
                     *(ulong *)(ringbuffer + uVar16 * 8 + lVar4);
            uVar12 = 0;
            if (uVar16 != 0) {
              for (; (uVar16 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
              }
            }
            uVar16 = (uVar12 >> 3 & 0x1fffffff) - lVar17;
          }
          uVar16 = uVar16 + uVar6;
          local_1980 = (uint)uVar1;
          if (0x7f < uVar16) {
            *(undefined4 *)(hasher + local_19b0 * 4 + 0x80038) =
                 *(undefined4 *)(hasher + (ulong)(local_1980 & uVar8) * 8 + 0x80038);
            uVar3 = *(undefined4 *)(hasher + (ulong)(local_1980 & uVar8) * 8 + 0x8003c);
            goto LAB_00116db4;
          }
          uVar6 = (ulong)(uVar8 & local_1980) * 2;
          if (ringbuffer[uVar16 + (uVar8 & local_1988)] < ringbuffer[uVar16 + uVar23]) {
            *(uint *)(hasher + local_19b0 * 4 + 0x80038) = uVar8;
            uVar6 = uVar6 | 1;
            uVar21 = uVar16;
            local_19b0 = uVar6;
          }
          else {
            *(uint *)(hasher + local_19a0 * 4 + 0x80038) = uVar8;
            uVar10 = uVar16;
            local_19a0 = uVar6;
          }
          uVar8 = *(uint *)(hasher + uVar6 * 4 + 0x80038);
        }
        uVar3 = *(undefined4 *)(hasher + 0x80030);
        *(undefined4 *)(hasher + local_19b0 * 4 + 0x80038) = uVar3;
LAB_00116db4:
        *(undefined4 *)(hasher + local_19a0 * 4 + 0x80038) = uVar3;
      }
      while (uVar18 = uVar18 - 1, uVar18 != 0) {
        if (num_bytes <= local_1970 + 4) {
          local_1970 = local_1970 + 1;
          break;
        }
        local_1970 = local_1970 + 1;
        EvaluateNode(position,local_1970,max_backward_limit,(size_t)dist_cache,(int *)&model,
                     (ZopfliCostModel *)&queue,(StartPosQueue *)nodes,nodes_00);
      }
    }
    local_1970 = local_1970 + 1;
  } while( true );
code_r0x00116488:
  lVar11 = lVar11 + -8;
  uVar23 = uVar23 + 1;
  goto LAB_00116476;
code_r0x00116608:
  lVar17 = lVar17 + -8;
  uVar24 = uVar24 + 1;
  goto LAB_001165eb;
code_r0x00116a9d:
  lVar17 = lVar17 + -8;
  uVar24 = uVar24 + 1;
  goto LAB_00116a81;
code_r0x00116caa:
  lVar17 = lVar17 + -8;
  uVar16 = uVar16 + 1;
  goto LAB_00116c8e;
}

Assistant:

size_t BrotliZopfliComputeShortestPath(MemoryManager* m,
    size_t num_bytes, size_t position, const uint8_t* ringbuffer,
    size_t ringbuffer_mask, const BrotliEncoderParams* params,
    const size_t max_backward_limit, const int* dist_cache, HasherHandle hasher,
    ZopfliNode* nodes) {
  const size_t max_zopfli_len = MaxZopfliLen(params);
  ZopfliCostModel model;
  StartPosQueue queue;
  BackwardMatch matches[2 * (MAX_NUM_MATCHES_H10 + 64)];
  const size_t store_end = num_bytes >= StoreLookaheadH10() ?
      position + num_bytes - StoreLookaheadH10() + 1 : position;
  size_t i;
  size_t gap = 0;
  size_t lz_matches_offset = 0;
  nodes[0].length = 0;
  nodes[0].u.cost = 0;
  InitZopfliCostModel(m, &model, &params->dist, num_bytes);
  if (BROTLI_IS_OOM(m)) return 0;
  ZopfliCostModelSetFromLiteralCosts(
      &model, position, ringbuffer, ringbuffer_mask);
  InitStartPosQueue(&queue);
  for (i = 0; i + HashTypeLengthH10() - 1 < num_bytes; i++) {
    const size_t pos = position + i;
    const size_t max_distance = BROTLI_MIN(size_t, pos, max_backward_limit);
    size_t skip;
    size_t num_matches = FindAllMatchesH10(hasher, &params->dictionary,
        ringbuffer, ringbuffer_mask, pos, num_bytes - i, max_distance, gap,
        params, &matches[lz_matches_offset]);
    if (num_matches > 0 &&
        BackwardMatchLength(&matches[num_matches - 1]) > max_zopfli_len) {
      matches[0] = matches[num_matches - 1];
      num_matches = 1;
    }
    skip = UpdateNodes(num_bytes, position, i, ringbuffer, ringbuffer_mask,
        params, max_backward_limit, dist_cache, num_matches, matches, &model,
        &queue, nodes);
    if (skip < BROTLI_LONG_COPY_QUICK_STEP) skip = 0;
    if (num_matches == 1 && BackwardMatchLength(&matches[0]) > max_zopfli_len) {
      skip = BROTLI_MAX(size_t, BackwardMatchLength(&matches[0]), skip);
    }
    if (skip > 1) {
      /* Add the tail of the copy to the hasher. */
      StoreRangeH10(hasher, ringbuffer, ringbuffer_mask, pos + 1, BROTLI_MIN(
          size_t, pos + skip, store_end));
      skip--;
      while (skip) {
        i++;
        if (i + HashTypeLengthH10() - 1 >= num_bytes) break;
        EvaluateNode(position, i, max_backward_limit, gap, dist_cache, &model,
            &queue, nodes);
        skip--;
      }
    }
  }
  CleanupZopfliCostModel(m, &model);
  return ComputeShortestPathFromNodes(num_bytes, nodes);
}